

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O0

void __thiscall indk::Neuron::Neuron(Neuron *this,Neuron *N)

{
  long lVar1;
  size_type sVar2;
  uint uVar3;
  int iVar4;
  int64_t iVar5;
  float *pfVar6;
  reference __args;
  Entry *this_00;
  Entry *E;
  Receptor *this_01;
  Receptor *R;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  Receptor *local_60;
  long local_58;
  int64_t i_1;
  size_type local_48;
  int64_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elabels;
  Neuron *N_local;
  Neuron *this_local;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
  ::vector(&this->Entries);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Links);
  std::vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>::vector
            (&this->Receptors);
  std::vector<float,_std::allocator<float>_>::vector(&this->OutputsPredefined);
  std::__cxx11::string::string((string *)&this->Name);
  std::__atomic_base<long>::operator=(&(this->t).super___atomic_base<long>,0);
  iVar5 = getTlo(N);
  this->Tlo = iVar5;
  uVar3 = getXm(N);
  this->Xm = uVar3;
  pfVar6 = (float *)operator_new(4);
  this->OutputSignal = pfVar6;
  this->OutputSignalSize = 1;
  this->OutputSignalPointer = 0;
  uVar3 = getDimensionsCount(N);
  this->DimensionsCount = uVar3;
  this->NID = 0;
  iVar4 = getProcessingMode(N);
  this->ProcessingMode = iVar4;
  iVar4 = getOutputMode(N);
  this->OutputMode = iVar4;
  this->Learned = false;
  getEntries_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i,N);
  local_48 = 0;
  while( true ) {
    sVar2 = local_48;
    iVar5 = getEntriesCount(N);
    if (iVar5 <= (long)sVar2) break;
    __args = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i,local_48);
    this_00 = (Entry *)operator_new(0x40);
    E = getEntry(N,local_48);
    Entry::Entry(this_00,E);
    i_1 = (int64_t)this_00;
    std::
    vector<std::pair<std::__cxx11::string,indk::Neuron::Entry*>,std::allocator<std::pair<std::__cxx11::string,indk::Neuron::Entry*>>>
    ::emplace_back<std::__cxx11::string&,indk::Neuron::Entry*>
              ((vector<std::pair<std::__cxx11::string,indk::Neuron::Entry*>,std::allocator<std::pair<std::__cxx11::string,indk::Neuron::Entry*>>>
                *)this,__args,(Entry **)&i_1);
    local_48 = local_48 + 1;
  }
  local_58 = 0;
  while( true ) {
    lVar1 = local_58;
    iVar5 = getReceptorsCount(N);
    if (iVar5 <= lVar1) break;
    this_01 = (Receptor *)operator_new(0x80);
    R = getReceptor(N,local_58);
    Receptor::Receptor(this_01,R);
    local_60 = this_01;
    std::vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>::push_back
              (&this->Receptors,&local_60);
    local_58 = local_58 + 1;
  }
  getLinkOutput_abi_cxx11_(&local_78,N);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->Links,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  return;
}

Assistant:

indk::Neuron::Neuron(const indk::Neuron &N) {
    t = 0;
    Tlo = N.getTlo();
    Xm = N.getXm();
    OutputSignal = new float;
    OutputSignalSize = 1;
    OutputSignalPointer = 0;
    DimensionsCount = N.getDimensionsCount();
    NID = 0;
    ProcessingMode = N.getProcessingMode();
    OutputMode = N.getOutputMode();
    Learned = false;
    auto elabels = N.getEntries();
    for (int64_t i = 0; i < N.getEntriesCount(); i++) Entries.emplace_back(elabels[i], new Entry(*N.getEntry(i)));
    for (int64_t i = 0; i < N.getReceptorsCount(); i++) Receptors.push_back(new Receptor(*N.getReceptor(i)));
    Links = N.getLinkOutput();
}